

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_format_proto3.pb.cc
# Opt level: O2

void proto3::TestEvilJson::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  int iVar2;
  Nullable<const_char_*> failure_msg;
  TestEvilJson *_this;
  TestEvilJson *local_20;
  MessageLite *local_18 [2];
  
  local_20 = (TestEvilJson *)to_msg;
  local_18[0] = from_msg;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<proto3::TestEvilJson_const*,proto3::TestEvilJson*>
                          ((TestEvilJson **)local_18,&local_20,"&from != _this");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
    if ((uVar1 & 0x7f) != 0) {
      if (((uVar1 & 1) != 0) && (iVar2 = (int)from_msg[1]._internal_metadata_.ptr_, iVar2 != 0)) {
        *(int *)((long)&local_20->field_0 + 8) = iVar2;
      }
      if (((uVar1 & 2) != 0) &&
         (iVar2 = *(int *)((long)&from_msg[1]._internal_metadata_.ptr_ + 4), iVar2 != 0)) {
        (local_20->field_0)._impl_.script_ = iVar2;
      }
      if (((uVar1 & 4) != 0) && (*(int *)&from_msg[2]._vptr_MessageLite != 0)) {
        *(int *)((long)&local_20->field_0 + 0x10) = *(int *)&from_msg[2]._vptr_MessageLite;
      }
      if (((uVar1 & 8) != 0) &&
         (iVar2 = *(int *)((long)&from_msg[2]._vptr_MessageLite + 4), iVar2 != 0)) {
        (local_20->field_0)._impl_.script_and_quotes_ = iVar2;
      }
      if (((uVar1 & 0x10) != 0) && (iVar2 = (int)from_msg[2]._internal_metadata_.ptr_, iVar2 != 0))
      {
        *(int *)((long)&local_20->field_0 + 0x18) = iVar2;
      }
      if (((uVar1 & 0x20) != 0) &&
         (iVar2 = *(int *)((long)&from_msg[2]._internal_metadata_.ptr_ + 4), iVar2 != 0)) {
        (local_20->field_0)._impl_.backslash_ = iVar2;
      }
      if (((uVar1 & 0x40) != 0) && (*(int *)&from_msg[3]._vptr_MessageLite != 0)) {
        *(int *)((long)&local_20->field_0 + 0x20) = *(int *)&from_msg[3]._vptr_MessageLite;
      }
    }
    (local_20->field_0)._impl_._has_bits_.has_bits_[0] =
         (local_20->field_0)._impl_._has_bits_.has_bits_[0] | uVar1;
    google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
              (&(local_20->super_Message).super_MessageLite._internal_metadata_,
               &from_msg->_internal_metadata_);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_18,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/util/json_format_proto3.pb.cc"
             ,0x2d63,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_18);
}

Assistant:

void TestEvilJson::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestEvilJson*>(&to_msg);
  auto& from = static_cast<const TestEvilJson&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:proto3.TestEvilJson)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000007fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      if (from._internal_regular_value() != 0) {
        _this->_impl_.regular_value_ = from._impl_.regular_value_;
      }
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      if (from._internal_script() != 0) {
        _this->_impl_.script_ = from._impl_.script_;
      }
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      if (from._internal_quotes() != 0) {
        _this->_impl_.quotes_ = from._impl_.quotes_;
      }
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      if (from._internal_script_and_quotes() != 0) {
        _this->_impl_.script_and_quotes_ = from._impl_.script_and_quotes_;
      }
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      if (from._internal_empty_string() != 0) {
        _this->_impl_.empty_string_ = from._impl_.empty_string_;
      }
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      if (from._internal_backslash() != 0) {
        _this->_impl_.backslash_ = from._impl_.backslash_;
      }
    }
    if ((cached_has_bits & 0x00000040u) != 0) {
      if (from._internal_low_codepoint() != 0) {
        _this->_impl_.low_codepoint_ = from._impl_.low_codepoint_;
      }
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}